

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

void __thiscall
TasGrid::Optimizer::CurrentNodes<(TasGrid::TypeOneDRule)15>::CurrentNodes
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *this,
          vector<double,_std::allocator<double>_> *cnodes,double new_node)

{
  vector<double,_std::allocator<double>_> local_48;
  double local_20;
  double new_node_local;
  vector<double,_std::allocator<double>_> *cnodes_local;
  CurrentNodes<(TasGrid::TypeOneDRule)15> *this_local;
  
  local_20 = new_node;
  new_node_local = (double)cnodes;
  cnodes_local = &this->nodes;
  ::std::vector<double,_std::allocator<double>_>::vector(&this->nodes,cnodes);
  ::std::vector<double,_std::allocator<double>_>::vector(&this->coeff);
  ::std::vector<double,_std::allocator<double>_>::push_back(&this->nodes,&local_20);
  makeCoefficients(&local_48,&this->nodes);
  ::std::vector<double,_std::allocator<double>_>::operator=(&this->coeff,&local_48);
  ::std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  return;
}

Assistant:

CurrentNodes(std::vector<double> const &cnodes, double new_node)
            : nodes(cnodes){
        nodes.push_back(new_node);
        coeff = makeCoefficients(nodes);
    }